

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  uint local_164;
  int local_160;
  int i;
  int errflg;
  int c;
  size_t len;
  char local_148 [4];
  int err;
  char erbuf [100];
  regmatch_t local_d8;
  regmatch_t subs [10];
  regex_t re;
  char **argv_local;
  int argc_local;
  
  local_160 = 0;
  progname = *argv;
  while (iVar2 = getopt(argc,argv,"c:e:S:E:x"), iVar2 != -1) {
    switch(iVar2) {
    case 0x3f:
    default:
      local_160 = local_160 + 1;
      break;
    case 0x45:
      iVar2 = atoi(_optarg);
      endoff = (regoff_t)iVar2;
      break;
    case 0x53:
      iVar2 = atoi(_optarg);
      startoff = (regoff_t)iVar2;
      break;
    case 99:
      copts = options(99,_optarg);
      break;
    case 0x65:
      eopts = options(0x65,_optarg);
      break;
    case 0x78:
      debug = debug + 1;
    }
  }
  if (local_160 != 0) {
    fprintf(_stderr,"usage: %s ",progname);
    fprintf(_stderr,"[-c copt][-C][-d] [re]\n");
    exit(2);
  }
  if (_optind < argc) {
    lVar6 = (long)_optind;
    _optind = _optind + 1;
    iVar2 = regcomp((regex_t *)&subs[9].rm_eo,argv[lVar6],copts);
    if (iVar2 != 0) {
      sVar4 = regerror(iVar2,(regex_t *)&subs[9].rm_eo,local_148,100);
      pFVar1 = _stderr;
      pcVar5 = eprint(iVar2);
      fprintf(pFVar1,"error %s, %d/%d `%s\'\n",pcVar5,sVar4 & 0xffffffff,100,local_148);
      exit(status);
    }
    regprint((regex_t *)&subs[9].rm_eo,_stdout);
    if (argc <= _optind) {
      regfree((regex_t *)&subs[9].rm_eo);
      exit(status);
    }
    if ((eopts & 4U) != 0) {
      local_d8.rm_so = (undefined4)startoff;
      local_d8.rm_eo = startoff._4_4_;
      sVar4 = strlen(argv[_optind]);
      subs[0].rm_so = sVar4 - endoff;
    }
    iVar2 = regexec((regex_t *)&subs[9].rm_eo,argv[_optind],10,&local_d8,eopts);
    if (iVar2 != 0) {
      sVar4 = regerror(iVar2,(regex_t *)&subs[9].rm_eo,local_148,100);
      pFVar1 = _stderr;
      pcVar5 = eprint(iVar2);
      fprintf(pFVar1,"error %s, %d/%d `%s\'\n",pcVar5,sVar4 & 0xffffffff,100,local_148);
      exit(status);
    }
    if ((copts & 4U) == 0) {
      uVar3 = (int)subs[0].rm_so - local_d8.rm_so;
      if (local_d8 != (regmatch_t)0xffffffffffffffff) {
        if (uVar3 == 0) {
          printf("match `\'@%.1s\n",argv[_optind] + (long)local_d8);
        }
        else {
          printf("match `%.*s\'\n",(ulong)uVar3,argv[_optind] + (long)local_d8);
        }
      }
      for (local_164 = 1; (int)local_164 < 10; local_164 = local_164 + 1) {
        if (subs[(long)(int)local_164 + -1].rm_eo != -1) {
          printf("(%d) `%.*s\'\n",(ulong)local_164,
                 (ulong)(uint)((int)subs[(int)local_164].rm_so -
                              (int)subs[(long)(int)local_164 + -1].rm_eo),
                 argv[_optind] + subs[(long)(int)local_164 + -1].rm_eo);
        }
      }
    }
    exit(status);
  }
  regress(_stdin);
  exit(status);
}

Assistant:

int main(argc, argv)
int argc;
char *argv[];
{
	regex_t re;
#	define	NS	10
	regmatch_t subs[NS];
	char erbuf[100];
	int err;
	size_t len;
	int c;
	int errflg = 0;
	register int i;
	extern int optind;
	extern char *optarg;

	progname = argv[0];

	while ((c = getopt(argc, argv, "c:e:S:E:x")) != EOF)
		switch (c) {
		case 'c':	/* compile options */
			copts = options('c', optarg);
			break;
		case 'e':	/* execute options */
			eopts = options('e', optarg);
			break;
		case 'S':	/* start offset */
			startoff = (regoff_t)atoi(optarg);
			break;
		case 'E':	/* end offset */
			endoff = (regoff_t)atoi(optarg);
			break;
		case 'x':	/* Debugging. */
			debug++;
			break;
		case '?':
		default:
			errflg++;
			break;
		}
	if (errflg) {
		fprintf(stderr, "usage: %s ", progname);
		fprintf(stderr, "[-c copt][-C][-d] [re]\n");
		exit(2);
	}

	if (optind >= argc) {
		regress(stdin);
		exit(status);
	}

	err = regcomp(&re, argv[optind++], copts);
	if (err) {
		len = regerror(err, &re, erbuf, sizeof(erbuf));
		fprintf(stderr, "error %s, %d/%d `%s'\n",
			eprint(err), (int)len, (int)sizeof(erbuf), erbuf);
		exit(status);
	}
	regprint(&re, stdout);	

	if (optind >= argc) {
		regfree(&re);
		exit(status);
	}

	if (eopts&REG_STARTEND) {
		subs[0].rm_so = startoff;
		subs[0].rm_eo = strlen(argv[optind]) - endoff;
	}
	err = regexec(&re, argv[optind], (size_t)NS, subs, eopts);
	if (err) {
		len = regerror(err, &re, erbuf, sizeof(erbuf));
		fprintf(stderr, "error %s, %d/%d `%s'\n",
			eprint(err), (int)len, (int)sizeof(erbuf), erbuf);
		exit(status);
	}
	if (!(copts&REG_NOSUB)) {
		len = (int)(subs[0].rm_eo - subs[0].rm_so);
		if (subs[0].rm_so != -1) {
			if (len != 0)
				printf("match `%.*s'\n", (int)len,
					argv[optind] + subs[0].rm_so);
			else
				printf("match `'@%.1s\n",
					argv[optind] + subs[0].rm_so);
		}
		for (i = 1; i < NS; i++)
			if (subs[i].rm_so != -1)
				printf("(%d) `%.*s'\n", i,
					(int)(subs[i].rm_eo - subs[i].rm_so),
					argv[optind] + subs[i].rm_so);
	}
	exit(status);
}